

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

void splitStr(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *rez,char *str,char splitter)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *prevPos;
  char *local_40;
  long local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(rez,(rez->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  cVar2 = *str;
  local_40 = str;
  if (cVar2 != '\0') {
    pcVar1 = str + 1;
    pcVar3 = str;
    do {
      str = pcVar1;
      if (cVar2 == splitter) {
        local_38 = (long)pcVar3 - (long)local_40;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&,long>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rez,
                   &local_40,&local_38);
        local_40 = str;
      }
      cVar2 = *str;
      pcVar3 = pcVar3 + 1;
      pcVar1 = str + 1;
    } while (cVar2 != '\0');
  }
  local_38 = (long)str - (long)local_40;
  if (local_40 <= str && local_38 != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,long>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rez,&local_40,
               &local_38);
  }
  return;
}

Assistant:

void splitStr(vector<string>& rez, const char* str, const char splitter)
{
    rez.clear();
    const char* prevPos = str;
    const char* buf = str;
    for (; *buf; buf++)
    {
        if (*buf == splitter)
        {
            rez.emplace_back(prevPos, buf - prevPos);
            prevPos = buf + 1;
        }
    }
    if (buf > prevPos)
        rez.emplace_back(prevPos, buf - prevPos);
}